

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

string * nlohmann::detail::exception::name(string *__return_storage_ptr__,string *ename,int id_)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  undefined8 *puVar4;
  uint uVar5;
  pointer *ppcVar6;
  size_type *psVar7;
  ulong uVar8;
  pointer pcVar9;
  uint __len;
  uint __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  pointer *local_90;
  long local_88;
  pointer local_80;
  long lStack_78;
  long *local_70;
  undefined8 local_68;
  long local_60;
  undefined8 uStack_58;
  size_type *local_50;
  string __str;
  
  std::operator+(&local_b0,"[json.exception.",ename);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  ppcVar6 = (pointer *)(plVar3 + 2);
  if ((pointer *)*plVar3 == ppcVar6) {
    local_80 = *ppcVar6;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *ppcVar6;
    local_90 = (pointer *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)ppcVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  __val = -id_;
  if (0 < id_) {
    __val = id_;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar5 = (uint)uVar8;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_0010c6e6;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_0010c6e6;
      }
      if (uVar5 < 10000) goto LAB_0010c6e6;
      uVar8 = uVar8 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_0010c6e6:
  local_50 = &__str._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)(id_ >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)id_ >> 0x1f) + (long)local_50),__len,__val);
  pcVar9 = (pointer)0xf;
  if (local_90 != &local_80) {
    pcVar9 = local_80;
  }
  if (pcVar9 < __str._M_dataplus._M_p + local_88) {
    pcVar9 = (pointer)0xf;
    if (local_50 != &__str._M_string_length) {
      pcVar9 = (pointer)__str._M_string_length;
    }
    if (__str._M_dataplus._M_p + local_88 <= pcVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_90);
      goto LAB_0010c773;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_50);
LAB_0010c773:
  local_70 = &local_60;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_60 = *plVar3;
    uStack_58 = puVar4[3];
  }
  else {
    local_60 = *plVar3;
    local_70 = (long *)*puVar4;
  }
  local_68 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar7) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50 != &__str._M_string_length) {
    operator_delete(local_50,__str._M_string_length + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,(ulong)(local_80 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string name(const std::string& ename, int id_)
    {
        return "[json.exception." + ename + "." + std::to_string(id_) + "] ";
    }